

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O0

DWORD __thiscall FNodeBuilder::CheckLoopEnd(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex)

{
  int iVar1;
  angle_t aVar2;
  angle_t aVar3;
  uint uVar4;
  int iVar5;
  FPrivVert *pFVar6;
  FPrivSeg *pFVar7;
  FPrivVert *pFVar8;
  angle_t diff_1;
  angle_t segAngle_1;
  FPrivSeg *seg_1;
  angle_t diff;
  angle_t segAngle;
  FPrivSeg *seg;
  DWORD bestseg;
  angle_t bestang;
  DWORD segnum;
  angle_t splitAngle;
  FPrivVert *v;
  int vertex_local;
  fixed_t dy_local;
  fixed_t dx_local;
  FNodeBuilder *this_local;
  
  pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)vertex);
  aVar2 = PointToAngle(dx,dy);
  bestseg = pFVar6->segs;
  seg._4_4_ = 0xffffffff;
  seg._0_4_ = 0xffffffff;
  do {
    if (bestseg == 0xffffffff) {
      if ((DWORD)seg == 0xffffffff) {
        this_local._4_4_ = 0xffffffff;
      }
      else {
        bestseg = pFVar6->segs2;
        while (bestseg != 0xffffffff) {
          pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                             (&this->Segs,(ulong)bestseg);
          pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar7->v1);
          iVar5 = (pFVar8->super_FSimpleVert).x;
          iVar1 = (pFVar6->super_FSimpleVert).x;
          pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar7->v1);
          aVar3 = PointToAngle(iVar5 - iVar1,
                               (pFVar8->super_FSimpleVert).y - (pFVar6->super_FSimpleVert).y);
          if ((aVar3 - (aVar2 + 0x80000000) < seg._4_4_) && (pFVar7->partner != (DWORD)seg)) {
            return 0xffffffff;
          }
          bestseg = pFVar7->nextforvert2;
        }
        this_local._4_4_ = (DWORD)seg;
      }
      return this_local._4_4_;
    }
    pFVar7 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)bestseg);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar7->v2);
    iVar5 = (pFVar8->super_FSimpleVert).x;
    iVar1 = (pFVar6->super_FSimpleVert).x;
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar7->v2);
    aVar3 = PointToAngle(iVar5 - iVar1,(pFVar8->super_FSimpleVert).y - (pFVar6->super_FSimpleVert).y
                        );
    uVar4 = aVar3 - (aVar2 + 0x80000000);
    if (uVar4 < 5000) {
      pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar7->v1);
      iVar5 = (pFVar8->super_FSimpleVert).x;
      pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar7->v1);
      iVar5 = PointOnSide(iVar5,(pFVar8->super_FSimpleVert).y,(pFVar6->super_FSimpleVert).x,
                          (pFVar6->super_FSimpleVert).y,dx,dy);
      if (iVar5 != 0) goto LAB_004d3c39;
    }
    else {
LAB_004d3c39:
      if (uVar4 <= seg._4_4_) {
        seg._0_4_ = bestseg;
        seg._4_4_ = uVar4;
      }
    }
    bestseg = pFVar7->nextforvert;
  } while( true );
}

Assistant:

DWORD FNodeBuilder::CheckLoopEnd (fixed_t dx, fixed_t dy, int vertex)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy) + ANGLE_180;
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg starting at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = segAngle - splitAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs ending at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs2;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = segAngle - splitAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert2;
	}
	return bestseg;
}